

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O3

void __thiscall
QExplicitlySharedDataPointer<QEventPointPrivate>::detach_helper
          (QExplicitlySharedDataPointer<QEventPointPrivate> *this)

{
  QEventPointPrivate *pQVar1;
  QEventPointPrivate *pQVar2;
  Data *pDVar3;
  
  pQVar2 = (QEventPointPrivate *)operator_new(0xe0);
  pQVar1 = (this->d).ptr;
  (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> = (__atomic_base<int>)0x0;
  pQVar2->device = pQVar1->device;
  pDVar3 = (pQVar1->window).wp.d;
  (pQVar2->window).wp.d = pDVar3;
  (pQVar2->window).wp.value = (pQVar1->window).wp.value;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar3->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar3 = (pQVar1->target).wp.d;
  (pQVar2->target).wp.d = pDVar3;
  (pQVar2->target).wp.value = (pQVar1->target).wp.value;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar3->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  memcpy(&pQVar2->pos,&pQVar1->pos,0xae);
  LOCK();
  (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar1 = (this->d).ptr;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + -1);
  UNLOCK();
  if ((__int_type)
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> == 0) {
    pQVar1 = (this->d).ptr;
    if (pQVar1 != (QEventPointPrivate *)0x0) {
      pDVar3 = (pQVar1->target).wp.d;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->weakref)._q_value.super___atomic_base<int>._M_i =
             (pDVar3->weakref)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar3->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
          pDVar3 = (pQVar1->target).wp.d;
          if (pDVar3 == (Data *)0x0) {
            pDVar3 = (Data *)0x0;
          }
          operator_delete(pDVar3);
        }
      }
      pDVar3 = (pQVar1->window).wp.d;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->weakref)._q_value.super___atomic_base<int>._M_i =
             (pDVar3->weakref)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar3->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
          pDVar3 = (pQVar1->window).wp.d;
          if (pDVar3 == (Data *)0x0) {
            pDVar3 = (Data *)0x0;
          }
          operator_delete(pDVar3);
        }
      }
    }
    operator_delete(pQVar1,0xe0);
  }
  (this->d).ptr = pQVar2;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QExplicitlySharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d->ref.deref())
        delete d.get();
    d.reset(x);
}